

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O3

void __thiscall SDLInputJoystick::ProcessInput(SDLInputJoystick *this)

{
  AxisInfo *pAVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  ulong in_RAX;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  BYTE buttonstate;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (0 < this->NumAxes) {
    iVar6 = 0x19c;
    lVar7 = 0;
    uVar9 = 0;
    do {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      sVar3 = SDL_JoystickGetAxis(this->Device,uVar9 & 0xffffffff);
      pAVar1 = (this->Axes).Array;
      *(double *)((long)&pAVar1->Value + lVar7) = (double)(int)sVar3 / 32767.0;
      dVar10 = Joy_RemoveDeadZone((double)(int)sVar3 / 32767.0,
                                  (double)*(float *)((long)&pAVar1->DeadZone + lVar7),
                                  (BYTE *)((long)&uStack_38 + 7));
      pAVar1 = (this->Axes).Array;
      *(double *)((long)&pAVar1->Value + lVar7) = dVar10;
      iVar8 = this->NumAxes;
      if (iVar8 == 1 || (int)uVar9 - 2U < 6) {
        Joy_GenerateButtonEvents((uint)(&pAVar1->ButtonValue)[lVar7],(uint)uStack_38._7_1_,2,iVar6);
        (&((this->Axes).Array)->ButtonValue)[lVar7] = uStack_38._7_1_;
        iVar8 = this->NumAxes;
      }
      uVar9 = uVar9 + 1;
      iVar6 = iVar6 + 2;
      lVar7 = lVar7 + 0x28;
    } while ((long)uVar9 < (long)iVar8);
    if (1 < iVar8) {
      pAVar1 = (this->Axes).Array;
      uVar4 = Joy_XYAxesToButtons(pAVar1->Value,pAVar1[1].Value);
      uStack_38 = CONCAT17((char)uVar4,(undefined7)uStack_38);
      Joy_GenerateButtonEvents((uint)((this->Axes).Array)->ButtonValue,uVar4 & 0xff,4,0x19c);
      ((this->Axes).Array)->ButtonValue = uStack_38._7_1_;
    }
  }
  if (0 < this->NumHats) {
    iVar6 = 0x188;
    iVar8 = 0;
    uVar4 = 0;
    do {
      iVar5 = this->NumAxes + iVar8;
      pAVar1 = (this->Axes).Array;
      bVar2 = SDL_JoystickGetHat(this->Device,uVar4);
      uStack_38 = CONCAT17(bVar2,(undefined7)uStack_38);
      if ((bVar2 & 1) == 0) {
        if ((bVar2 & 4) == 0) {
          pAVar1[(long)iVar5 + 1].Value = 0.0;
        }
        else {
          pAVar1[(long)iVar5 + 1].Value = 1.0;
        }
      }
      else {
        pAVar1[(long)iVar5 + 1].Value = -1.0;
      }
      if ((bVar2 & 2) == 0) {
        if ((bVar2 & 8) == 0) {
          pAVar1[iVar5].Value = 0.0;
        }
        else {
          pAVar1[iVar5].Value = -1.0;
        }
      }
      else {
        pAVar1[iVar5].Value = 1.0;
      }
      if (uVar4 < 4) {
        Joy_GenerateButtonEvents((uint)pAVar1[iVar5].ButtonValue,(uint)bVar2,4,iVar6);
        pAVar1[iVar5].ButtonValue = uStack_38._7_1_;
      }
      uVar4 = uVar4 + 1;
      iVar6 = iVar6 + 4;
      iVar8 = iVar8 + 2;
    } while ((int)uVar4 < this->NumHats);
  }
  return;
}

Assistant:

void ProcessInput()
	{
		BYTE buttonstate;

		for (int i = 0; i < NumAxes; ++i)
		{
			buttonstate = 0;

			Axes[i].Value = SDL_JoystickGetAxis(Device, i)/32767.0;
			Axes[i].Value = Joy_RemoveDeadZone(Axes[i].Value, Axes[i].DeadZone, &buttonstate);

			// Map button to axis
			// X and Y are handled differently so if we have 2 or more axes then we'll use that code instead.
			if (NumAxes == 1 || (i >= 2 && i < NUM_JOYAXISBUTTONS))
			{
				Joy_GenerateButtonEvents(Axes[i].ButtonValue, buttonstate, 2, KEY_JOYAXIS1PLUS + i*2);
				Axes[i].ButtonValue = buttonstate;
			}
		}

		if(NumAxes > 1)
		{
			buttonstate = Joy_XYAxesToButtons(Axes[0].Value, Axes[1].Value);
			Joy_GenerateButtonEvents(Axes[0].ButtonValue, buttonstate, 4, KEY_JOYAXIS1PLUS);
			Axes[0].ButtonValue = buttonstate;
		}

		// Map POV hats to buttons and axes.  Why axes?  Well apparently I have
		// a gamepad where the left control stick is a POV hat (instead of the
		// d-pad like you would expect, no that's pressure sensitive).  Also
		// KDE's joystick dialog maps them to axes as well.
		for (int i = 0; i < NumHats; ++i)
		{
			AxisInfo &x = Axes[NumAxes + i*2];
			AxisInfo &y = Axes[NumAxes + i*2 + 1];

			buttonstate = SDL_JoystickGetHat(Device, i);

			// If we're going to assume that we can pass SDL's value into
			// Joy_GenerateButtonEvents then we might as well assume the format here.
			if(buttonstate & 0x1) // Up
				y.Value = -1.0;
			else if(buttonstate & 0x4) // Down
				y.Value = 1.0;
			else
				y.Value = 0.0;
			if(buttonstate & 0x2) // Left
				x.Value = 1.0;
			else if(buttonstate & 0x8) // Right
				x.Value = -1.0;
			else
				x.Value = 0.0;

			if(i < 4)
			{
				Joy_GenerateButtonEvents(x.ButtonValue, buttonstate, 4, KEY_JOYPOV1_UP + i*4);
				x.ButtonValue = buttonstate;
			}
		}
	}